

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::force_vote_msg::serialize(force_vote_msg *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ptr<buffer> pVar1;
  buffer_serializer bs;
  uint8_t CURRENT_VERSION;
  size_t len;
  ptr<buffer> *ret;
  size_t in_stack_000000f8;
  element_type *peVar2;
  ptr<buffer> *in_stack_ffffffffffffffb8;
  buffer_serializer *in_stack_ffffffffffffffc0;
  uint8_t in_stack_ffffffffffffffcf;
  buffer_serializer *in_stack_ffffffffffffffd0;
  
  peVar2 = in_RDI;
  buffer::alloc(in_stack_000000f8);
  buffer_serializer::buffer_serializer
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(endianness)((ulong)peVar2 >> 0x20)
            );
  buffer_serializer::put_u8(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> force_vote_msg::serialize() const {
    //   << Format >>
    // version                      1 byte
    // ... to be added ...

    size_t len = sizeof(uint8_t);
    ptr<buffer> ret = buffer::alloc(len);

    const uint8_t CURRENT_VERSION = 0x0;
    buffer_serializer bs(ret);
    bs.put_u8(CURRENT_VERSION);
    return ret;
}